

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>
            *this,uint numberOfColumns,Column_settings *colSettings)

{
  ulong __new_size;
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  *pvVar1;
  __hashtable *__this;
  allocator_type local_3e;
  key_equal local_3d;
  hash<unsigned_int> local_3c;
  allocator_type local_3b;
  key_equal local_3a;
  hash<unsigned_int> local_39;
  R_matrix *local_38;
  
  __new_size = (ulong)numberOfColumns;
  (this->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->reducedMatrixR_).super_Matrix_dimension_option.maxDim_ = -1;
  pvVar1 = (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
            *)operator_new(0x18);
  (pvVar1->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reducedMatrixR_).super_Matrix_row_access_option.rows_ = pvVar1;
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  ::resize(pvVar1,__new_size);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->reducedMatrixR_).matrix_._M_h,__new_size,&local_3c,&local_3d,&local_3e);
  (this->reducedMatrixR_).nextInsertIndex_ = 0;
  (this->reducedMatrixR_).colSettings_ = colSettings;
  local_38 = &this->reducedMatrixR_;
  pvVar1 = (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
            *)operator_new(0x18);
  (pvVar1->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mirrorMatrixU_).super_Matrix_row_access_option.rows_ = pvVar1;
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>_>_>
  ::resize(pvVar1,__new_size);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->mirrorMatrixU_).matrix_._M_h,__new_size,&local_39,&local_3a,&local_3b);
  (this->mirrorMatrixU_).nextInsertIndex_ = 0;
  (this->mirrorMatrixU_).colSettings_ = colSettings;
  (this->pivotToColumnIndex_)._M_h._M_buckets = &(this->pivotToColumnIndex_)._M_h._M_single_bucket;
  (this->pivotToColumnIndex_)._M_h._M_bucket_count = 1;
  (this->pivotToColumnIndex_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pivotToColumnIndex_)._M_h._M_element_count = 0;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pivotToColumnIndex_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->nextEventIndex_ = 0;
  this->operators_ = &colSettings->operators;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->pivotToColumnIndex_)._M_h,__new_size);
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(unsigned int numberOfColumns, Column_settings* colSettings)
    : Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      reducedMatrixR_(numberOfColumns, colSettings),
      mirrorMatrixU_(numberOfColumns, colSettings),
      nextEventIndex_(0),
      operators_(nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(numberOfColumns);
  } else {
    pivotToColumnIndex_.resize(numberOfColumns, Master_matrix::template get_null_value<Index>());
  }
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(numberOfColumns);
  }
  if constexpr (Master_matrix::Option_list::has_vine_update) {
    Swap_opt::_positionToRowIdx().reserve(numberOfColumns);
  }
}